

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-input.h
# Opt level: O2

_Bool fy_input_is_lb(fy_input *fyi,int c)

{
  _Bool _Var1;
  
  _Var1 = true;
  if (((c != 10) && (c != 0xd)) &&
     (((fyi != (fy_input *)0x0 && ((fyi->field_0x74 & 1) != 0)) ||
      ((1 < c - 0x2028U && (c != 0x85)))))) {
    _Var1 = false;
  }
  return _Var1;
}

Assistant:

static inline bool fy_input_is_lb(const struct fy_input *fyi, int c) {
    /* '\r', '\n' are always linebreaks */
    if (fy_is_json_lb(c))
        return true;
    if (fyi && fyi->json_mode)
        return false;
    return fy_is_yaml12_lb(c);
}